

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithLogTestGeneratedPlainDepfileMtime::BuildWithLogTestGeneratedPlainDepfileMtime
          (BuildWithLogTestGeneratedPlainDepfileMtime *this)

{
  BuildWithLogTestGeneratedPlainDepfileMtime *this_local;
  
  BuildWithLogTest::BuildWithLogTest(&this->super_BuildWithLogTest);
  (this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.super_Test.
  _vptr_Test = (_func_int **)&PTR__BuildWithLogTestGeneratedPlainDepfileMtime_002a18d8;
  (this->super_BuildWithLogTest).super_BuildTest.super_BuildLogUser._vptr_BuildLogUser =
       (_func_int **)&DAT_002a1918;
  return;
}

Assistant:

TEST_F(BuildWithLogTest, GeneratedPlainDepfileMtime) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule generate-depfile\n"
"  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\n"
"build out: generate-depfile\n"
"  test_dependency = inimp\n"
"  depfile = out.d\n"));
  fs_.Create("inimp", "");
  fs_.Tick();

  string err;

  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  command_runner_.commands_ran_.clear();
  state_.Reset();
  builder_.Cleanup();
  builder_.plan_.Reset();

  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());
}